

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_sf2.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  _Atomic_word *p_Var1;
  SFModulatorItem modulator;
  element_type *args_1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  pointer __s;
  value_type_conflict1 *__val;
  long lVar7;
  int iVar8;
  int iVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  initializer_list<sf2cute::SFGeneratorItem> __l;
  initializer_list<sf2cute::SFInstrumentZone> __l_00;
  initializer_list<sf2cute::SFPresetZone> __l_01;
  shared_ptr<sf2cute::SFInstrument> instrument_50;
  shared_ptr<sf2cute::SFSample> sample_50;
  vector<short,_std::allocator<short>_> data_50;
  shared_ptr<sf2cute::SFPreset> preset_50;
  SFInstrumentZone instrument_zone;
  ofstream ofs;
  SoundFont sf2;
  allocator_type local_531;
  undefined8 local_530;
  undefined8 local_528;
  undefined1 local_51c [8];
  SFGeneratorItem local_514;
  vector<sf2cute::SFInstrumentZone,_std::allocator<sf2cute::SFInstrumentZone>_> local_510;
  undefined1 local_4f8 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4e0;
  pointer local_4d8;
  pointer local_4d0;
  pointer local_4c8;
  weak_ptr<sf2cute::SFInstrument> local_4c0;
  undefined1 local_4b0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490;
  undefined1 local_480 [8];
  undefined1 local_478 [16];
  _Alloc_hider _Stack_468;
  undefined1 local_460 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  _Alloc_hider local_448;
  undefined1 local_440 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  undefined1 local_3f8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0;
  _Alloc_hider local_3e0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  _Alloc_hider local_3c0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  _Alloc_hider local_3a0 [2];
  undefined1 local_390 [16];
  _Alloc_hider _Stack_380;
  pointer local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  _Alloc_hider local_360;
  element_type *local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_350 [11];
  ios_base local_298 [264];
  undefined1 local_190 [104];
  string local_128 [32];
  string local_108 [232];
  
  sf2cute::SoundFont::SoundFont((SoundFont *)local_190);
  local_3b0._M_allocated_capacity = (size_type)local_3a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"EMU8000","");
  std::__cxx11::string::operator=((string *)(local_190 + 0x48),(string *)local_3b0._M_local_buf);
  if ((_Alloc_hider *)local_3b0._0_8_ != local_3a0) {
    operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0[0]._M_p + 1));
  }
  local_3d0._M_allocated_capacity = (size_type)local_3c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"Chipsound","");
  std::__cxx11::string::operator=(local_128,(string *)local_3d0._M_local_buf);
  if ((_Alloc_hider *)local_3d0._0_8_ != local_3c0) {
    operator_delete((void *)local_3d0._0_8_,(ulong)(local_3c0[0]._M_p + 1));
  }
  local_3f0._M_allocated_capacity = (size_type)local_3e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_3f8 + 8),"ROM","");
  std::__cxx11::string::operator=(local_108,(string *)(local_3f8 + 8));
  if ((_Alloc_hider *)local_3f0._0_8_ != local_3e0) {
    operator_delete((void *)local_3f0._0_8_,(ulong)(local_3e0[0]._M_p + 1));
  }
  __s = (pointer)operator_new(400);
  lVar7 = 0;
  local_4d8 = __s;
  local_4c8 = __s + 0x19;
  memset(__s,0,400);
  auVar6 = _DAT_00115050;
  auVar5 = _DAT_00115040;
  auVar4 = _DAT_00115030;
  auVar3 = _DAT_00115020;
  auVar2 = _DAT_00115010;
  do {
    auVar9._8_4_ = (int)lVar7;
    auVar9._0_8_ = lVar7;
    auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar11 = (auVar9 | auVar5) ^ auVar6;
    iVar8 = auVar11._0_4_;
    iVar10 = auVar11._8_4_;
    auVar16._4_4_ = iVar8;
    auVar16._0_4_ = iVar8;
    auVar16._8_4_ = iVar10;
    auVar16._12_4_ = iVar10;
    auVar20._0_4_ = -(uint)(iVar8 < -0x7fffff9c);
    auVar20._4_4_ = -(uint)(iVar8 < -0x7fffff9c);
    auVar20._8_4_ = -(uint)(iVar10 < -0x7fffff9c);
    auVar20._12_4_ = -(uint)(iVar10 < -0x7fffff9c);
    auVar12._0_4_ = -(uint)(auVar11._4_4_ == -0x80000000);
    auVar12._4_4_ = -(uint)(auVar11._4_4_ == -0x80000000);
    auVar12._8_4_ = -(uint)(auVar11._12_4_ == -0x80000000);
    auVar12._12_4_ = -(uint)(auVar11._12_4_ == -0x80000000);
    auVar12 = auVar12 & auVar20;
    auVar11 = pshuflw(auVar16,auVar12,0xe8);
    auVar11 = packssdw(auVar11,auVar11);
    if ((auVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined2 *)
       ((long)&(__s->super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
       lVar7 * 2) = 0x4000;
    }
    auVar11 = packssdw(auVar12,auVar12);
    auVar11 = packssdw(auVar11,auVar11);
    if ((auVar11._0_4_ >> 0x10 & 1) != 0) {
      *(undefined2 *)
       ((long)&(__s->super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
       lVar7 * 2 + 2) = 0x4000;
    }
    auVar11 = (auVar9 | auVar4) ^ auVar6;
    iVar8 = auVar11._0_4_;
    iVar10 = auVar11._8_4_;
    auVar17._4_4_ = iVar8;
    auVar17._0_4_ = iVar8;
    auVar17._8_4_ = iVar10;
    auVar17._12_4_ = iVar10;
    auVar21._0_4_ = -(uint)(iVar8 < -0x7fffff9c);
    auVar21._4_4_ = -(uint)(iVar8 < -0x7fffff9c);
    auVar21._8_4_ = -(uint)(iVar10 < -0x7fffff9c);
    auVar21._12_4_ = -(uint)(iVar10 < -0x7fffff9c);
    auVar13._0_4_ = -(uint)(auVar11._4_4_ == -0x80000000);
    auVar13._4_4_ = -(uint)(auVar11._4_4_ == -0x80000000);
    auVar13._8_4_ = -(uint)(auVar11._12_4_ == -0x80000000);
    auVar13._12_4_ = -(uint)(auVar11._12_4_ == -0x80000000);
    auVar13 = auVar13 & auVar21;
    auVar11 = packssdw(auVar17,auVar13);
    auVar11 = packssdw(auVar11,auVar11);
    if ((auVar11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined2 *)
       ((long)&(__s->super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
       lVar7 * 2 + 4) = 0x4000;
    }
    auVar11 = pshufhw(auVar13,auVar13,0x84);
    auVar11 = packssdw(auVar11,auVar11);
    if ((auVar11 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined2 *)
       ((long)&(__s->super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
       lVar7 * 2 + 6) = 0x4000;
    }
    auVar11 = (auVar9 | auVar3) ^ auVar6;
    iVar8 = auVar11._0_4_;
    iVar10 = auVar11._8_4_;
    auVar18._4_4_ = iVar8;
    auVar18._0_4_ = iVar8;
    auVar18._8_4_ = iVar10;
    auVar18._12_4_ = iVar10;
    auVar22._0_4_ = -(uint)(iVar8 < -0x7fffff9c);
    auVar22._4_4_ = -(uint)(iVar8 < -0x7fffff9c);
    auVar22._8_4_ = -(uint)(iVar10 < -0x7fffff9c);
    auVar22._12_4_ = -(uint)(iVar10 < -0x7fffff9c);
    auVar14._0_4_ = -(uint)(auVar11._4_4_ == -0x80000000);
    auVar14._4_4_ = -(uint)(auVar11._4_4_ == -0x80000000);
    auVar14._8_4_ = -(uint)(auVar11._12_4_ == -0x80000000);
    auVar14._12_4_ = -(uint)(auVar11._12_4_ == -0x80000000);
    auVar14 = auVar14 & auVar22;
    auVar11 = pshuflw(auVar18,auVar14,0xe8);
    auVar11 = packssdw(auVar11,auVar11);
    if ((auVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined2 *)
       ((long)&(__s->super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi + lVar7 * 2) = 0x4000;
    }
    auVar11 = packssdw(auVar14,auVar14);
    auVar11 = packssdw(auVar11,auVar11);
    if ((auVar11 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      *(undefined2 *)
       ((long)&(__s->super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi + lVar7 * 2 + 2) = 0x4000;
    }
    auVar9 = (auVar9 | auVar2) ^ auVar6;
    iVar8 = auVar9._0_4_;
    iVar10 = auVar9._8_4_;
    auVar15._4_4_ = iVar8;
    auVar15._0_4_ = iVar8;
    auVar15._8_4_ = iVar10;
    auVar15._12_4_ = iVar10;
    auVar19._0_4_ = -(uint)(iVar8 < -0x7fffff9c);
    auVar19._4_4_ = -(uint)(iVar8 < -0x7fffff9c);
    auVar19._8_4_ = -(uint)(iVar10 < -0x7fffff9c);
    auVar19._12_4_ = -(uint)(iVar10 < -0x7fffff9c);
    auVar11._0_4_ = -(uint)(auVar9._4_4_ == -0x80000000);
    auVar11._4_4_ = -(uint)(auVar9._4_4_ == -0x80000000);
    auVar11._8_4_ = -(uint)(auVar9._12_4_ == -0x80000000);
    auVar11._12_4_ = -(uint)(auVar9._12_4_ == -0x80000000);
    auVar11 = auVar11 & auVar19;
    auVar9 = packssdw(auVar15,auVar11);
    auVar9 = packssdw(auVar9,auVar9);
    if ((auVar9 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined2 *)
       ((long)&(__s->super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi + lVar7 * 2 + 4) = 0x4000;
    }
    auVar9 = pshufhw(auVar11,auVar11,0x84);
    auVar9 = packssdw(auVar9,auVar9);
    if ((auVar9 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined2 *)
       ((long)&(__s->super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi + lVar7 * 2 + 6) = 0x4000;
    }
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x68);
  local_4d0 = __s + 0x19;
  memset(&__s[0xc].super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ,0,200);
  local_390._0_8_ = (ulong)(uint)local_390._4_4_ << 0x20;
  local_478._0_4_ = 200;
  local_510.
  super__Vector_base<sf2cute::SFInstrumentZone,_std::allocator<sf2cute::SFInstrumentZone>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xac44;
  local_4f8._0_4_ = 0x39;
  local_4b0._0_4_ = 0;
  sf2cute::SoundFont::
  NewSample<char_const(&)[7],std::vector<short,std::allocator<short>>&,int,unsigned_int,int,int,int>
            ((SoundFont *)(local_4f8 + 0x10),(char (*) [7])local_190,
             (vector<short,_std::allocator<short>_> *)"Square",(int *)&local_4d8,(uint *)local_390,
             (int *)local_478,(int *)&local_510,(int *)local_4f8);
  local_4b0._16_8_ = local_4f8._16_8_;
  local_4b0._24_8_ = local_4e0;
  if (local_4e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_4e0->_M_weak_count = local_4e0->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      local_4e0->_M_weak_count = local_4e0->_M_weak_count + 1;
    }
  }
  sf2cute::SFGeneratorItem::SFGeneratorItem
            ((SFGeneratorItem *)local_390,kSampleModes,(GenAmountType)0x1);
  __l._M_len = 1;
  __l._M_array = (iterator)local_390;
  std::vector<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_>::vector
            ((vector<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_> *)
             &local_490,__l,(allocator_type *)&local_510);
  local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               )0x0;
  local_418._M_allocated_capacity = 0;
  sf2cute::SFInstrumentZone::SFInstrumentZone
            ((SFInstrumentZone *)local_478,(weak_ptr<sf2cute::SFSample> *)(local_4b0 + 0x10),
             (vector<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_> *)
             &local_490,
             (vector<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_> *)
             &local_428);
  if ((void *)local_428._M_allocated_capacity != (void *)0x0) {
    operator_delete((void *)local_428._M_allocated_capacity,
                    local_418._M_allocated_capacity - local_428._0_8_);
  }
  if ((void *)local_490._M_allocated_capacity != (void *)0x0) {
    operator_delete((void *)local_490._M_allocated_capacity,(long)local_480 - local_490._0_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b0._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (_Atomic_word *)(local_4b0._24_8_ + 0xc);
      iVar8 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar8 = *(_Atomic_word *)(local_4b0._24_8_ + 0xc);
      *(int *)(local_4b0._24_8_ + 0xc) = iVar8 + -1;
    }
    if (iVar8 == 1) {
      (**(code **)(*(long *)local_4b0._24_8_ + 0x18))();
    }
  }
  sf2cute::SFGeneratorItem::SFGeneratorItem(&local_514,kReverbEffectsSend,(GenAmountType)0x26a);
  sf2cute::SFZone::SetGenerator((SFZone *)local_478,local_514);
  sf2cute::SFModulator::SFModulator
            ((SFModulator *)&local_528,kNoteOnVelocity,kDecrease,kUnipolar,kConcave);
  sf2cute::SFModulator::SFModulator((SFModulator *)&local_530,0);
  sf2cute::SFModulatorItem::SFModulatorItem
            ((SFModulatorItem *)&local_408,
             (SFModulator)((uint5)local_528._4_4_ << 0x20 | (uint5)(uint)local_528),
             kInitialAttenuation,0x3c0,
             (SFModulator)((uint5)local_530._4_4_ << 0x20 | (uint5)(uint)local_530),kLinear);
  modulator.key_.amount_source_op_.controller_ = local_408._M_local_buf[8];
  modulator.key_.amount_source_op_.controller_palette_ = local_408._M_local_buf[9];
  modulator.key_.amount_source_op_.direction_ = local_408._M_local_buf[10];
  modulator.key_.amount_source_op_.polarity_ = local_408._M_local_buf[0xb];
  modulator.key_.amount_source_op_.type_ = local_408._M_local_buf[0xc];
  modulator.key_._13_1_ = local_408._M_local_buf[0xd];
  modulator.amount_ = local_408._14_2_;
  modulator.key_.source_op_.controller_ = local_408._M_local_buf[0];
  modulator.key_.source_op_.controller_palette_ = local_408._M_local_buf[1];
  modulator.key_.source_op_.direction_ = local_408._M_local_buf[2];
  modulator.key_.source_op_.polarity_ = local_408._M_local_buf[3];
  modulator.key_.source_op_.type_ = local_408._M_local_buf[4];
  modulator.key_._5_1_ = local_408._M_local_buf[5];
  modulator.key_.destination_op_ = local_408._M_allocated_capacity._6_2_;
  modulator._16_2_ = local_3f8._0_2_;
  sf2cute::SFZone::SetModulator((SFZone *)local_478,modulator);
  local_390._8_8_ = local_478._8_8_;
  _Stack_380._M_p = _Stack_468._M_p;
  local_378 = (pointer)local_460;
  stack0xfffffffffffffb90 = (undefined1  [16])0x0;
  local_460 = (undefined1  [8])0x0;
  local_370._M_allocated_capacity = local_458._0_8_;
  local_370._8_8_ = local_458._8_8_;
  local_360._M_p = local_448._M_p;
  local_458 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               )0x0;
  local_448._M_p = (pointer)0x0;
  local_390._0_8_ = &PTR__SFInstrumentZone_0011e7c8;
  local_358 = (element_type *)local_440._0_8_;
  aaStack_350[0]._M_allocated_capacity = local_440._8_8_;
  local_440._0_8_ = (element_type *)0x0;
  local_440._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  aaStack_350[0]._8_8_ = local_440._16_8_;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_390;
  std::vector<sf2cute::SFInstrumentZone,_std::allocator<sf2cute::SFInstrumentZone>_>::vector
            (&local_510,__l_00,(allocator_type *)local_4b0);
  sf2cute::SoundFont::
  NewInstrument<std::__cxx11::string_const&,std::vector<sf2cute::SFInstrumentZone,std::allocator<sf2cute::SFInstrumentZone>>>
            ((SoundFont *)local_4f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
             (vector<sf2cute::SFInstrumentZone,_std::allocator<sf2cute::SFInstrumentZone>_> *)
             local_4f8._16_8_);
  std::vector<sf2cute::SFInstrumentZone,_std::allocator<sf2cute::SFInstrumentZone>_>::~vector
            (&local_510);
  sf2cute::SFInstrumentZone::~SFInstrumentZone((SFInstrumentZone *)local_390);
  args_1 = (element_type *)CONCAT44(local_4f8._4_4_,local_4f8._0_4_);
  local_51c._4_4_ = 0;
  local_51c._0_4_ = 0;
  local_4c0.super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4f8._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_4f8._8_8_ + 0xc) = *(_Atomic_word *)(local_4f8._8_8_ + 0xc) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_4f8._8_8_ + 0xc) = *(_Atomic_word *)(local_4f8._8_8_ + 0xc) + 1;
    }
  }
  local_4c0.super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_ptr = args_1;
  sf2cute::SFPresetZone::SFPresetZone((SFPresetZone *)local_390,&local_4c0);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_390;
  std::vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_>::vector
            ((vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_> *)&local_510,
             __l_01,&local_531);
  sf2cute::SoundFont::
  NewPreset<std::__cxx11::string_const&,int,int,std::vector<sf2cute::SFPresetZone,std::allocator<sf2cute::SFPresetZone>>>
            ((SoundFont *)local_4b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
             (int *)args_1,(int *)(local_51c + 4),
             (vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_> *)local_51c);
  std::vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_>::~vector
            ((vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_> *)&local_510);
  sf2cute::SFPresetZone::~SFPresetZone((SFPresetZone *)local_390);
  if (local_4c0.super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_4c0.super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar8 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar8 = (local_4c0.super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count;
      (local_4c0.super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count = iVar8 + -1;
    }
    if (iVar8 == 1) {
      (*(local_4c0.super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  std::ofstream::ofstream(local_390,"output.sf2",_S_bin);
  sf2cute::SoundFont::Write((SoundFont *)local_190,(ostream *)local_390);
  local_390._0_8_ = _VTT;
  *(undefined8 *)(local_390 + (long)_VTT[-3]) = __filebuf;
  std::filebuf::~filebuf((filebuf *)(local_390 + 8));
  std::ios_base::~ios_base(local_298);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b0._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4f8._8_8_);
  }
  sf2cute::SFInstrumentZone::~SFInstrumentZone((SFInstrumentZone *)local_478);
  if (local_4e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4e0);
  }
  if (local_4d8 != (pointer)0x0) {
    operator_delete(local_4d8,(long)local_4c8 - (long)local_4d8);
  }
  sf2cute::SoundFont::~SoundFont((SoundFont *)local_190);
  return 0;
}

Assistant:

int main(int argc, char * argv[]) {
  SoundFont sf2;

  // Set metadata.
  sf2.set_sound_engine("EMU8000");
  sf2.set_bank_name("Chipsound");
  sf2.set_rom_name("ROM");

  // Construct sample datapoints.
  std::vector<int16_t> data_50 = MakePulseVector(4);

  // Add a sample.
  std::shared_ptr<SFSample> sample_50 = sf2.NewSample(
    "Square",                 // name
    data_50,                  // sample data
    0,                        // start loop
    uint32_t(data_50.size()), // end loop
    44100,                    // sample rate
    57,                       // root key
    0);                       // microtuning

  // Make an instrument zone.
  SFInstrumentZone instrument_zone(sample_50,
    std::vector<SFGeneratorItem>{
      //SFGeneratorItem(SFGenerator::kKeyRange, RangesType(0, 127)),
      //SFGeneratorItem(SFGenerator::kVelRange, RangesType(0, 127)),
      SFGeneratorItem(SFGenerator::kSampleModes, uint16_t(SampleMode::kLoopContinuously)),
    },
    std::vector<SFModulatorItem>{});
  // Add more generators or modulators if necessary.
  instrument_zone.SetGenerator(SFGeneratorItem(SFGenerator::kReverbEffectsSend, 618));
  instrument_zone.SetModulator(SFModulatorItem(
      SFModulator(SFGeneralController::kNoteOnVelocity,
      SFControllerDirection::kDecrease, SFControllerPolarity::kUnipolar,
      SFControllerType::kConcave),
    SFGenerator::kInitialAttenuation,
    960,
    SFModulator(0),
    SFTransform::kLinear));

  // Add an instrument.
  std::shared_ptr<SFInstrument> instrument_50 = sf2.NewInstrument(
    sample_50->name(),
    std::vector<SFInstrumentZone>{
      std::move(instrument_zone)
    });

  // Add a preset.
  std::shared_ptr<SFPreset> preset_50 = sf2.NewPreset(
    instrument_50->name(), 0, 0,
    std::vector<SFPresetZone>{
      SFPresetZone(instrument_50)
    });

  // Print the tree for debugging.
#ifdef SF2CUTE_EXAMPLES_DEBUG_HPP_
  PrintSoundFont(sf2);
#endif

  // Write SoundFont file.
  try {
    std::ofstream ofs("output.sf2", std::ios::binary);
    sf2.Write(ofs);
    return 0;
  }
  catch (const std::fstream::failure & e) {
    // File output error.
    std::cerr << e.what() << std::endl;
    return 1;
  }
  catch (const std::exception & e) {
    // Other errors.
    // For example: Too many samples.
    std::cerr << e.what() << std::endl;
    return 1;
  }
}